

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O2

void __thiscall adjMaxtrix<char>::print(adjMaxtrix<char> *this)

{
  pointer pcVar1;
  ostream *poVar2;
  pointer pcVar3;
  int i;
  ulong uVar4;
  int j;
  ulong uVar5;
  
  uVar4 = 0;
  while( true ) {
    pcVar1 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)pcVar3 - (long)pcVar1) <= uVar4) break;
    for (uVar5 = 0; uVar5 < (ulong)((long)pcVar3 - (long)pcVar1); uVar5 = uVar5 + 1) {
      *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 6;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->edge[uVar4][uVar5]);
      std::operator<<(poVar2," ");
      pcVar1 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar3 = (this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void adjMaxtrix<dataType>::print() {
	for (int i = 0; i < vexs.size(); i++) {
		for (int j = 0; j < vexs.size(); j++) {
			cout << setw(6) << edge[i][j] << " ";
		}
		cout << endl;
	}
}